

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

MTBDD mtbdd_enum_all_first(MTBDD dd,MTBDD variables,uint8_t *arr,mtbdd_enum_filter_cb filter_cb)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  mtbddnode_t node;
  MTBDD variables_00;
  mtbddnode_t n;
  MTBDD res;
  MTBDD high;
  MTBDD low;
  mtbddnode_t ndd;
  mtbddnode_t nv;
  mtbdd_enum_filter_cb filter_cb_local;
  uint8_t *arr_local;
  MTBDD variables_local;
  MTBDD dd_local;
  
  if (dd == 0) {
    dd_local = 0;
  }
  else {
    dd_local = dd;
    if (variables == 0x8000000000000000) {
      if ((filter_cb != (mtbdd_enum_filter_cb)0x0) && (iVar1 = (*filter_cb)(dd), iVar1 == 0)) {
        dd_local = 0;
      }
    }
    else {
      iVar1 = mtbdd_isleaf(dd);
      if (iVar1 == 0) {
        node = MTBDD_GETNODE(variables);
        variables_00 = mtbddnode_followhigh(variables,node);
        n = MTBDD_GETNODE(dd);
        uVar2 = mtbddnode_getvariable(n);
        uVar3 = mtbddnode_getvariable(node);
        res = dd;
        high = dd;
        if (uVar2 == uVar3) {
          high = mtbddnode_followlow(dd,n);
          res = mtbddnode_followhigh(dd,n);
        }
        dd_local = mtbdd_enum_all_first(high,variables_00,arr + 1,filter_cb);
        if (dd_local == 0) {
          dd_local = mtbdd_enum_all_first(res,variables_00,arr + 1,filter_cb);
          if (dd_local == 0) {
            dd_local = 0;
          }
          else {
            *arr = '\x01';
          }
        }
        else {
          *arr = '\0';
        }
      }
      else {
        filter_cb_local = (mtbdd_enum_filter_cb)arr;
        arr_local = (uint8_t *)variables;
        if ((filter_cb == (mtbdd_enum_filter_cb)0x0) || (iVar1 = (*filter_cb)(dd), iVar1 != 0)) {
          while (arr_local != (uint8_t *)0x8000000000000000) {
            *filter_cb_local = (_func_int_MTBDD)0x0;
            arr_local = (uint8_t *)mtbdd_gethigh((MTBDD)arr_local);
            filter_cb_local = filter_cb_local + 1;
          }
        }
        else {
          dd_local = 0;
        }
      }
    }
  }
  return dd_local;
}

Assistant:

MTBDD
mtbdd_enum_all_first(MTBDD dd, MTBDD variables, uint8_t *arr, mtbdd_enum_filter_cb filter_cb)
{
    if (dd == mtbdd_false) {
        // the leaf False is skipped
        return mtbdd_false;
    } else if (variables == mtbdd_true) {
        // if this assertion fails, then <variables> is not the support of <dd>.
        // actually, remove this check to allow for "partial" enumeration
        // assert(mtbdd_isleaf(dd));
        // for _first, just return the leaf; there is nothing to set, though.
        if (filter_cb != NULL && filter_cb(dd) == 0) return mtbdd_false;
        return dd;
    } else if (mtbdd_isleaf(dd)) {
        // a leaf for which the filter returns 0 is skipped
        if (filter_cb != NULL && filter_cb(dd) == 0) return mtbdd_false;
        // for all remaining variables, set to 0
        while (variables != mtbdd_true) {
            *arr++ = 0;
            variables = mtbdd_gethigh(variables);
        }
        return dd;
    } else {
        // get next variable from <variables>
        mtbddnode_t nv = MTBDD_GETNODE(variables);
        variables = node_gethigh(variables, nv);

        // get cofactors
        mtbddnode_t ndd = MTBDD_GETNODE(dd);
        MTBDD low, high;
        if (mtbddnode_getvariable(ndd) == mtbddnode_getvariable(nv)) {
            low = node_getlow(dd, ndd);
            high = node_gethigh(dd, ndd);
        } else {
            low = high = dd;
        }

        // first maybe follow low
        MTBDD res = mtbdd_enum_all_first(low, variables, arr+1, filter_cb);
        if (res != mtbdd_false) {
            *arr = 0;
            return res;
        }

        // if not low, try following high
        res = mtbdd_enum_all_first(high, variables, arr+1, filter_cb);
        if (res != mtbdd_false) {
            *arr = 1;
            return res;
        }

        // we've tried low and high, return false
        return mtbdd_false;
    }
}